

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall
glslang::TVariable::TVariable(TVariable *this,TString *name,TString *mangledName,TType *t,bool uT)

{
  bool uT_local;
  TType *t_local;
  TString *mangledName_local;
  TString *name_local;
  TVariable *this_local;
  
  TSymbol::TSymbol(&this->super_TSymbol,name,mangledName);
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_013a9990;
  TType::TType(&this->type,EbtVoid,EvqTemporary,1,0,0,false);
  this->userType = uT;
  TConstUnionArray::TConstUnionArray(&this->constArray);
  this->constSubtree = (TIntermTyped *)0x0;
  this->memberExtensions = (TVector<glslang::TVector<const_char_*>_> *)0x0;
  this->anonId = -1;
  TType::shallowCopy(&this->type,t);
  return;
}

Assistant:

TVariable(const TString *name, const TString *mangledName, const TType& t, bool uT = false )
        : TSymbol(name, mangledName),
          userType(uT),
          constSubtree(nullptr),
          memberExtensions(nullptr),
          anonId(-1)
        { type.shallowCopy(t); }